

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

CompoundStmt * __thiscall Parser::compound_statement(Parser *this)

{
  uint uVar1;
  pointer *pppSVar2;
  int iVar3;
  iterator __position;
  Stmt *in_RAX;
  CompoundStmt *pCVar4;
  ulong uVar5;
  pointer pTVar6;
  ulong uVar7;
  Stmt *s;
  Stmt *local_28;
  
  local_28 = in_RAX;
  pCVar4 = (CompoundStmt *)operator_new(0x28);
  (pCVar4->super_Stmt).super_Node.kind = CompoundStmt;
  (pCVar4->super_Stmt).super_Node._vptr_Node = (_func_int **)&PTR__CompoundStmt_00117c70;
  (pCVar4->stmts).super__Vector_base<Stmt_*,_std::allocator<Stmt_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pCVar4->stmts).super__Vector_base<Stmt_*,_std::allocator<Stmt_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pCVar4->stmts).super__Vector_base<Stmt_*,_std::allocator<Stmt_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->tok->kind != Punctuator) || (this->tok->i != 0x7b)) {
    error<char_const(&)[31]>(this,(char (*) [31])"expecting \'{\' to start a block");
  }
  iVar3 = this->tok_i;
  uVar1 = iVar3 + 1;
  this->tok_i = uVar1;
  if (-2 < iVar3) {
    uVar5 = (ulong)uVar1;
    pTVar6 = (this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = ((long)(this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pTVar6 >> 2) *
            -0x3333333333333333;
    if (uVar5 <= uVar7 && uVar7 - uVar5 != 0) {
      pTVar6 = pTVar6 + uVar5;
      goto LAB_0010eb98;
    }
  }
  pTVar6 = &this->eof;
LAB_0010eb98:
  this->tok = pTVar6;
  do {
    if (pTVar6->kind == Punctuator) {
      if (pTVar6->i == 0x7d) {
        return pCVar4;
      }
    }
    else if (pTVar6->kind == Eof) {
      error<char_const(&)[25]>(this,(char (*) [25])"expecting \'}\' before EOF");
LAB_0010ebfc:
      (*(pCVar4->super_Stmt).super_Node._vptr_Node[1])(pCVar4);
      return (CompoundStmt *)0x0;
    }
    local_28 = statement(this);
    if (local_28 == (Stmt *)0x0) goto LAB_0010ebfc;
    __position._M_current =
         (pCVar4->stmts).super__Vector_base<Stmt_*,_std::allocator<Stmt_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pCVar4->stmts).super__Vector_base<Stmt_*,_std::allocator<Stmt_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Stmt*,std::allocator<Stmt*>>::_M_realloc_insert<Stmt*const&>
                ((vector<Stmt*,std::allocator<Stmt*>> *)&pCVar4->stmts,__position,&local_28);
    }
    else {
      *__position._M_current = local_28;
      pppSVar2 = &(pCVar4->stmts).super__Vector_base<Stmt_*,_std::allocator<Stmt_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppSVar2 = *pppSVar2 + 1;
    }
    pTVar6 = this->tok;
  } while( true );
}

Assistant:

CompoundStmt* Parser::compound_statement()
{
  auto b = std::make_unique<CompoundStmt>();

  if (!is_punctuator('{'))
    error("expecting '{' to start a block");

  next_token();                 // Skip '{'

  while (tok->kind != TokenKind::Eof) {
    if (is_punctuator('}')) {
      return b.release();
    }
    else {
      auto s = statement();
      if (s)
        b->stmts.push_back(s);
      else
        return nullptr;
    }
  }

  error("expecting '}' before EOF");
  return nullptr;
}